

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_ecb(uchar *out,uchar *in,size_t nblocks,uint64_t *rkeys,uint nrounds)

{
  ulong in_RDX;
  uint64_t *in_RSI;
  uint32_t *in_RDI;
  uchar t [64];
  uint32_t blocks [16];
  size_t in_stack_ffffffffffffff58;
  uint32_t *in_stack_ffffffffffffff60;
  
  for (; 3 < in_RDX; in_RDX = in_RDX - 4) {
    br_range_dec32le(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(uchar *)0x1060f1);
    aes_ecb4x((uchar *)t._0_8_,in_RDI,in_RSI,(uint)(in_RDX >> 0x20));
    in_RSI = in_RSI + 8;
    in_RDI = in_RDI + 0x10;
  }
  if (in_RDX != 0) {
    br_range_dec32le(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(uchar *)0x10617c);
    aes_ecb4x((uchar *)t._0_8_,in_RDI,in_RSI,(uint)(in_RDX >> 0x20));
    memcpy(in_RDI,&stack0xffffffffffffff58,in_RDX << 4);
  }
  return;
}

Assistant:

static void aes_ecb(unsigned char *out, const unsigned char *in, size_t nblocks, const uint64_t *rkeys, unsigned int nrounds) {
    uint32_t blocks[16];
    unsigned char t[64];

    while (nblocks >= 4) {
        br_range_dec32le(blocks, 16, in);
        aes_ecb4x(out, blocks, rkeys, nrounds);
        nblocks -= 4;
        in += 64;
        out += 64;
    }

    if (nblocks) {
        br_range_dec32le(blocks, nblocks * 4, in);
        aes_ecb4x(t, blocks, rkeys, nrounds);
        memcpy(out, t, nblocks * 16);
    }
}